

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O2

shared_ptr<const_BayesianGameForDecPOMDPStage> * __thiscall
boost::shared_ptr<BayesianGameForDecPOMDPStage_const>::operator=
          (shared_ptr<BayesianGameForDecPOMDPStage_const> *this,
          shared_ptr<BayesianGameForDecPOMDPStage> *r)

{
  element_type *peVar1;
  sp_counted_base *psVar2;
  shared_count sStack_10;
  
  peVar1 = r->px;
  psVar2 = (r->pn).pi_;
  r->px = (element_type *)0x0;
  (r->pn).pi_ = (sp_counted_base *)0x0;
  sStack_10.pi_ = *(sp_counted_base **)(this + 8);
  *(element_type **)this = peVar1;
  *(sp_counted_base **)(this + 8) = psVar2;
  detail::shared_count::~shared_count(&sStack_10);
  return (shared_ptr<const_BayesianGameForDecPOMDPStage> *)this;
}

Assistant:

shared_ptr & operator=( shared_ptr<Y> && r ) BOOST_NOEXCEPT
    {
        this_type( static_cast< shared_ptr<Y> && >( r ) ).swap( *this );
        return *this;
    }